

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O0

void NOPL3_Reset(opl3_chip *chip,uint32_t clock,uint32_t samplerate)

{
  byte bVar1;
  int iVar2;
  opl3_channel *poVar3;
  ulong uVar4;
  byte local_2a;
  byte local_29;
  uint8_t local_ch_slot;
  uint8_t channum;
  uint8_t slotnum;
  opl3_channel *channel;
  opl3_slot *slot;
  uint32_t samplerate_local;
  uint32_t clock_local;
  opl3_chip *chip_local;
  
  memset(chip->channel,0,0x630);
  memset(chip->slot,0,0xb40);
  for (local_29 = 0; local_29 < 0x24; local_29 = local_29 + 1) {
    uVar4 = (ulong)local_29;
    chip->slot[uVar4].chip = chip;
    chip->slot[uVar4].mod = &zeromod;
    chip->slot[uVar4].eg_rout = 0x1ff;
    chip->slot[uVar4].eg_out = 0x1ff;
    chip->slot[uVar4].eg_gen = '\x03';
    chip->slot[uVar4].trem = (uint8_t *)&zeromod;
    chip->slot[uVar4].slot_num = local_29;
  }
  for (local_2a = 0; local_2a < 0x12; local_2a = local_2a + 1) {
    poVar3 = chip->channel + local_2a;
    bVar1 = ""[local_2a];
    poVar3->slotz[0] = chip->slot + bVar1;
    poVar3->slotz[1] = chip->slot + (bVar1 + 3);
    chip->slot[bVar1].channel = chip->channel + local_2a;
    chip->slot[bVar1 + 3].channel = chip->channel + local_2a;
    if ((uint)local_2a % 9 < 3) {
      poVar3->pair = chip->channel + (local_2a + 3);
    }
    else if ((uint)local_2a % 9 < 6) {
      poVar3->pair = chip->channel + (local_2a - 3);
    }
    poVar3->chip = chip;
    poVar3->out[0] = &zeromod;
    poVar3->out[1] = &zeromod;
    poVar3->out[2] = &zeromod;
    poVar3->out[3] = &zeromod;
    poVar3->chtype = '\0';
    poVar3->cha = 0xffff;
    poVar3->chb = 0xffff;
    poVar3->ch_num = local_2a;
    OPL3_ChannelSetupAlg(chip->channel + local_2a);
  }
  chip->noise = 1;
  chip->rateratio = (int32_t)(((ulong)samplerate * 0x48000) / (ulong)clock);
  iVar2 = chip->rateratio + -0x400;
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  if (iVar2 < 2) {
    chip->rateratio = 0x400;
  }
  chip->tremoloshift = '\x04';
  chip->vibshift = '\x01';
  chip->address = 0;
  chip->timer = 0;
  chip->eg_timer = 0;
  chip->eg_add = '\0';
  chip->eg_state = '\0';
  chip->eg_timerrem = '\0';
  chip->tremolo = '\0';
  chip->rhy = '\0';
  chip->nts = '\0';
  chip->newm = '\0';
  chip->tremolopos = '\0';
  chip->vibpos = '\0';
  chip->mixbuff[1] = 0;
  chip->mixbuff[0] = 0;
  chip->rm_hh_bit8 = '\0';
  chip->rm_hh_bit7 = '\0';
  chip->rm_hh_bit3 = '\0';
  chip->rm_hh_bit2 = '\0';
  chip->rm_tc_bit5 = '\0';
  chip->rm_tc_bit3 = '\0';
  chip->samplecnt = 0;
  chip->oldsamples[1] = 0;
  chip->oldsamples[0] = 0;
  chip->samples[1] = 0;
  chip->samples[0] = 0;
  chip->writebuf_samplecnt = 0;
  chip->writebuf_last = 0;
  chip->writebuf_cur = 0;
  chip->writebuf_lasttime = 0;
  memset(chip->writebuf,0,0x4000);
  return;
}

Assistant:

void NOPL3_Reset(opl3_chip *chip, uint32_t clock, uint32_t samplerate)
{
    opl3_slot *slot;
    opl3_channel *channel;
    uint8_t slotnum;
    uint8_t channum;
    uint8_t local_ch_slot;

    //memset(chip, 0, sizeof(opl3_chip));
    memset(chip->channel, 0x00, sizeof(opl3_channel) * 18);
    memset(chip->slot, 0x00, sizeof(opl3_slot) * 36);
    for (slotnum = 0; slotnum < 36; slotnum++)
    {
        slot = &chip->slot[slotnum];
        slot->chip = chip;
        slot->mod = &zeromod;
        slot->eg_rout = 0x1ff;
        slot->eg_out = 0x1ff;
        slot->eg_gen = envelope_gen_num_release;
        slot->trem = (const uint8_t*)&zeromod;
        slot->slot_num = slotnum;
    }
    for (channum = 0; channum < 18; channum++)
    {
        channel = &chip->channel[channum];
        local_ch_slot = ch_slot[channum];
        channel->slotz[0] = &chip->slot[local_ch_slot];
        channel->slotz[1] = &chip->slot[local_ch_slot + 3u];
        chip->slot[local_ch_slot].channel = &chip->channel[channum];
        chip->slot[local_ch_slot + 3u].channel = &chip->channel[channum];
        if ((channum % 9) < 3)
        {
            channel->pair = &chip->channel[channum + 3u];
        }
        else if ((channum % 9) < 6)
        {
            channel->pair = &chip->channel[channum - 3u];
        }
        channel->chip = chip;
        channel->out[0] = &zeromod;
        channel->out[1] = &zeromod;
        channel->out[2] = &zeromod;
        channel->out[3] = &zeromod;
        channel->chtype = ch_2op;
        channel->cha = 0xffff;
        channel->chb = 0xffff;
#if OPL_ENABLE_STEREOEXT
        channel->leftpan = 0x10000;
        channel->rightpan = 0x10000;
#endif
        channel->ch_num = channum;
        OPL3_ChannelSetupAlg(&chip->channel[channum]);
    }
    chip->noise = 1;
    //chip->rateratio = (samplerate << RSM_FRAC) / 49716;
    // ratio: sampleRate / (clock / 288) * (1 << resamplerFraction)
    chip->rateratio = (int32_t)((((uint64_t)288 * samplerate) << RSM_FRAC) / clock);
    if (abs(chip->rateratio - (1 << RSM_FRAC)) <= 1)
        chip->rateratio = (1 << RSM_FRAC);
    chip->tremoloshift = 4;
    chip->vibshift = 1;

#if OPL_ENABLE_STEREOEXT
    if (!panpot_lut_build)
    {
        int32_t i;
        for (i = 0; i < 256; i++)
        {
            panpot_lut[i] = OPL_SIN(i);
        }
        panpot_lut_build = 1;
    }
#endif

    chip->address = 0;
    chip->timer = 0;
    chip->eg_timer = 0;
    chip->eg_timerrem = chip->eg_state = chip->eg_add = 0;
    chip->newm = chip->nts = chip->rhy = chip->tremolo = 0;
    chip->vibpos = chip->tremolopos = 0;
    chip->mixbuff[0] = chip->mixbuff[1] = 0;
    chip->rm_hh_bit2 = chip->rm_hh_bit3 = chip->rm_hh_bit7 = chip->rm_hh_bit8 = 0;
    chip->rm_tc_bit3 = chip->rm_tc_bit5 = 0;

    chip->samplecnt = 0;
    chip->oldsamples[0] = chip->oldsamples[1] = 0;
    chip->samples[0] = chip->samples[1] = 0;
#ifdef NOPL_ENABLE_WRITEBUF
    chip->writebuf_samplecnt = 0;
    chip->writebuf_cur = chip->writebuf_last = 0;
    chip->writebuf_lasttime = 0;
    memset(chip->writebuf, 0x00, sizeof(opl3_writebuf) * OPL_WRITEBUF_SIZE);
#endif
}